

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O0

void __thiscall OptStrTokIter::OptStrTokIter(OptStrTokIter *this,char *tokens,char *delimiters)

{
  size_t sVar1;
  pointer pcVar2;
  char *pcVar3;
  undefined8 in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  unique_ptr<char[],_std::default_delete<char[]>_> *in_stack_ffffffffffffffb8;
  OptIterRwd *in_stack_ffffffffffffffc0;
  unique_ptr<char[],_std::default_delete<char[]>_> *this_00;
  size_t in_stack_ffffffffffffffd8;
  
  OptIterRwd::OptIterRwd(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__OptStrTokIter_0042a4c8;
  sVar1 = strlen(in_RSI);
  *(int *)(in_RDI + 1) = (int)sVar1;
  in_RDI[2] = in_RSI;
  in_RDI[3] = in_RDX;
  in_RDI[4] = 0;
  this_00 = (unique_ptr<char[],_std::default_delete<char[]>_> *)(in_RDI + 5);
  std::unique_ptr<char[],std::default_delete<char[]>>::unique_ptr<std::default_delete<char[]>,void>
            (this_00);
  if (in_RDI[3] == 0) {
    in_RDI[3] = default_delims;
  }
  std::make_unique<char[]>(in_stack_ffffffffffffffd8);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::operator=
            (this_00,in_stack_ffffffffffffffb8);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(this_00);
  pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(this_00);
  strcpy(pcVar2,(char *)in_RDI[2]);
  pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(this_00);
  pcVar3 = strtok(pcVar2,(char *)in_RDI[3]);
  in_RDI[4] = pcVar3;
  return;
}

Assistant:

OptStrTokIter::OptStrTokIter(const char * tokens, const char * delimiters)
   : len(unsigned(strlen(tokens))), str(tokens), seps(delimiters),
     cur(NULLSTR)
{
   if (seps == NULL)  seps = default_delims;
   tokstr = std::make_unique<char[]>(len + 1);
   (void) strcpy(tokstr.get(), str);
   cur = strtok(tokstr.get(), seps);
}